

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O2

ostream * setup::operator<<(ostream *os,windows_version *version)

{
  data *this;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  
  operator<<(os,&version->win_version);
  this = &version->nt_version;
  bVar1 = windows_version::data::operator!=(this,&version->win_version);
  if (bVar1) {
    poVar2 = std::operator<<(os,"  nt ");
    operator<<(poVar2,this);
  }
  pcVar3 = anon_unknown_2::get_version_name(&version->win_version,false);
  pcVar4 = anon_unknown_2::get_version_name(this,true);
  if (pcVar3 == (char *)0x0 && pcVar4 == (char *)0x0) goto LAB_0013ba0a;
  std::operator<<(os," (");
  if (pcVar3 == (char *)0x0) {
    if (pcVar4 != (char *)0x0) goto LAB_0013b9f4;
  }
  else {
    std::operator<<(os,pcVar3);
    if (pcVar4 != pcVar3 && pcVar4 != (char *)0x0) {
      std::operator<<(os," / ");
LAB_0013b9f4:
      std::operator<<(os,pcVar4);
    }
  }
  std::operator<<(os,')');
LAB_0013ba0a:
  if ((version->nt_service_pack).minor != 0 || (version->nt_service_pack).major != 0) {
    poVar2 = std::operator<<(os," service pack ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    if ((version->nt_service_pack).minor != 0) {
      poVar2 = std::operator<<(os,'.');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version & version) {
	
	os << version.win_version;
	if(version.nt_version != version.win_version) {
		os << "  nt " << version.nt_version;
	}
	
	const char * win_name = get_version_name(version.win_version);
	const char * nt_name = get_version_name(version.nt_version, true);
	
	if(win_name || nt_name) {
		os << " (";
		if(win_name) {
			os << win_name;
		}
		if(nt_name && nt_name != win_name) {
			if(win_name) {
				os << " / ";
			}
			os << nt_name;
		}
		os << ')';
	}
	
	if(version.nt_service_pack.major || version.nt_service_pack.minor) {
		os << " service pack " << version.nt_service_pack.major;
		if(version.nt_service_pack.minor) {
			os << '.' << version.nt_service_pack.minor;
		}
	}
	
	return os;
}